

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

double fmod_one(double x)

{
  int iVar1;
  double res;
  double x_local;
  
  iVar1 = psf_lrint(x);
  x_local = x - (double)iVar1;
  if (x_local < 0.0) {
    x_local = x_local + 1.0;
  }
  return x_local;
}

Assistant:

static inline double
fmod_one (double x)
{	double res ;

	res = x - psf_lrint (x) ;
	if (res < 0.0)
		return res + 1.0 ;

	return res ;
}